

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O1

void __thiscall QImageData::~QImageData(QImageData *this)

{
  Data *pDVar1;
  
  if (this->cleanupFunction != (QImageCleanupFunction)0x0) {
    (*this->cleanupFunction)(this->cleanupInfo);
  }
  if ((this->field_0x70 & 8) != 0) {
    QImagePixmapCleanupHooks::executeImageHooks
              ((long)this->detach_no | (ulong)(uint)this->ser_no << 0x20);
  }
  if (this->paintEngine != (QPaintEngine *)0x0) {
    (*this->paintEngine->_vptr_QPaintEngine[1])();
  }
  if ((this->data != (uchar *)0x0) && ((this->field_0x70 & 1) != 0)) {
    QtPrivate::sizedFree(this->data,this->nbytes);
  }
  this->data = (uchar *)0x0;
  QColorSpace::~QColorSpace(&this->colorSpace);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->text).d);
  pDVar1 = (this->colortable).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->colortable).d.d)->super_QArrayData,4,0x10);
      return;
    }
  }
  return;
}

Assistant:

QImageData::~QImageData()
{
    if (cleanupFunction)
        cleanupFunction(cleanupInfo);
    if (is_cached)
        QImagePixmapCleanupHooks::executeImageHooks((((qint64) ser_no) << 32) | ((qint64) detach_no));
    delete paintEngine;
    if (data && own_data)
        QtPrivate::sizedFree(data, nbytes);
    data = nullptr;
}